

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

void merge_cache_lcp_2way<false,unsigned_char>
               (uchar **from0,lcp_t *lcp_input0,uchar *cache_input0,size_t n0,uchar **from1,
               lcp_t *lcp_input1,uchar *cache_input1,size_t n1,uchar **result,lcp_t *lcp_result,
               uchar *cache_result)

{
  byte c;
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  uchar **__dest;
  uchar *puVar4;
  lcp_t lcp0;
  lcp_t lVar5;
  byte local_c1;
  uchar **local_c0;
  size_t local_b0;
  lcp_t *local_a8;
  byte *local_a0;
  lcp_t local_98;
  lcp_t *local_90;
  size_t local_88;
  byte *local_80;
  string local_70;
  string local_50;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"merge_cache_lcp_2way",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(): n0=",7);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", n1=",5);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_70,1);
  check_input<unsigned_char>(from0,lcp_input0,cache_input0,n0);
  check_input<unsigned_char>(from1,lcp_input1,cache_input1,n1);
  local_a0 = cache_input0 + 1;
  local_c1 = *cache_input0;
  local_80 = cache_input1 + 1;
  c = *cache_input1;
  local_90 = lcp_input1;
  if (local_c1 < c) {
    puVar4 = *from0;
    if (puVar4 == (uchar *)0x0) {
LAB_00244d6b:
      __assert_fail("a != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x51,"int cmp(const unsigned char *, const unsigned char *)");
    }
    if (*from1 == (uchar *)0x0) {
LAB_00244d8a:
      __assert_fail("b != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x52,"int cmp(const unsigned char *, const unsigned char *)");
    }
    iVar1 = strcmp((char *)puVar4,(char *)*from1);
    if (-1 < iVar1) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                   );
    }
    local_88 = n1;
    *result = puVar4;
    __dest = result + 1;
    local_b0 = n0 - 1;
    from1 = from1;
    if (local_b0 != 0) {
      local_c0 = from0 + 1;
      local_a8 = lcp_input0 + 1;
      local_c1 = cache_input0[1];
      local_a0 = cache_input0 + 2;
      local_98 = 0;
      lcp0 = *lcp_input0;
      goto LAB_002445df;
    }
  }
  else {
    local_b0 = n0;
    local_c0 = from0;
    local_a8 = lcp_input0;
    if (c < local_c1) {
      if (*from0 == (uchar *)0x0) goto LAB_00244d6b;
      puVar4 = *from1;
      if (puVar4 == (uchar *)0x0) goto LAB_00244d8a;
      iVar1 = strcmp((char *)*from0,(char *)puVar4);
      if (iVar1 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x45c,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                     );
      }
      *result = puVar4;
      local_88 = n1 - 1;
      if (local_88 != 0) {
        from1 = from1 + 1;
        local_90 = lcp_input1 + 1;
        c = cache_input1[1];
        local_80 = cache_input1 + 2;
        lcp0 = 0;
        local_98 = *lcp_input1;
        goto LAB_002445df;
      }
LAB_0024446f:
      __dest = result + 1;
LAB_00244474:
      if (local_b0 == 0) {
        __assert_fail("n0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x527,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                     );
      }
      goto LAB_00244cf6;
    }
    if (local_c1 == 0) {
      puVar4 = *from0;
      if (puVar4 == (uchar *)0x0) goto LAB_00244d6b;
      if (*from1 == (uchar *)0x0) goto LAB_00244d8a;
      iVar1 = strcmp((char *)puVar4,(char *)*from1);
      if (iVar1 != 0) {
        __assert_fail("cmp(*from0, *from1) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x470,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                     );
      }
      local_88 = n1;
      *result = puVar4;
      __dest = result + 1;
      local_b0 = n0 - 1;
      from1 = from1;
      if (local_b0 != 0) {
        local_c0 = from0 + 1;
        lcp0 = *lcp_input0;
        local_a8 = lcp_input0 + 1;
        local_c1 = cache_input0[1];
        local_a0 = cache_input0 + 2;
        local_98 = 0;
        c = 0;
        goto LAB_002445df;
      }
    }
    else {
      compare((uchar *)&local_70,*from0,(size_t)*from1);
      local_98 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
      if ((int)local_70._M_string_length < 0) {
        *result = *from0;
        if (*from1 == (uchar *)0x0) {
LAB_00244e25:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x26,"unsigned char get_char(unsigned char *, size_t)");
        }
        local_88 = n1;
        __dest = result + 1;
        local_b0 = n0 - 1;
        from1 = from1;
        if (local_b0 != 0) {
          local_c1 = cache_input0[1];
          local_a0 = cache_input0 + 2;
          lcp0 = *lcp_input0;
          local_a8 = lcp_input0 + 1;
          local_c0 = from0 + 1;
          c = (*from1)[local_98];
          goto LAB_002445df;
        }
      }
      else {
        if ((int)local_70._M_string_length != 0) {
          *result = *from1;
          if (*from0 == (uchar *)0x0) goto LAB_00244e25;
          local_88 = n1 - 1;
          if (local_88 != 0) {
            local_c1 = (*from0)[local_98];
            local_90 = lcp_input1 + 1;
            from1 = from1 + 1;
            c = cache_input1[1];
            local_80 = cache_input1 + 2;
            lcp0 = local_98;
            local_98 = *lcp_input1;
            goto LAB_002445df;
          }
          goto LAB_0024446f;
        }
        local_88 = n1;
        *result = *from0;
        __dest = result + 1;
        local_b0 = n0 - 1;
        from1 = from1;
        if (local_b0 != 0) {
          local_c0 = from0 + 1;
          lcp0 = *lcp_input0;
          local_a8 = lcp_input0 + 1;
          local_c1 = cache_input0[1];
          local_a0 = cache_input0 + 2;
          c = 0;
LAB_002445df:
          __dest = result + 1;
LAB_002445e4:
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                              __debug_indent_str_abi_cxx11_._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Starting loop, n0=",0x12);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", n1=",5);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ...\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tprev   = \'",0xb);
          puVar4 = __dest[-1];
          iVar1 = (int)poVar2;
          if (puVar4 == (uchar *)0x0) {
            std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
          }
          else {
            sVar3 = strlen((char *)puVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)puVar4,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t*from0 = \'",0xb);
          puVar4 = *local_c0;
          if (puVar4 == (uchar *)0x0) {
            std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
          }
          else {
            sVar3 = strlen((char *)puVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)puVar4,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t*from1 = \'",0xb);
          puVar4 = *from1;
          if (puVar4 == (uchar *)0x0) {
            std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
          }
          else {
            sVar3 = strlen((char *)puVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)puVar4,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tlcp0   = ",10);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tlcp1   = ",10);
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tcache0 = \'",0xb);
          to_str_abi_cxx11_(&local_70,local_c1);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                                      local_70._M_dataplus._M_p._0_1_),
                              CONCAT44(local_70._M_string_length._4_4_,
                                       (int)local_70._M_string_length));
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tcache1 = \'",0xb);
          to_str_abi_cxx11_(&local_50,c);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,local_50._M_dataplus._M_p,local_50._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'\n",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_
                                    ));
          }
          check_lcp_and_cache<unsigned_char>(__dest[-1],*local_c0,lcp0,local_c1,*from1,local_98,c);
          if (local_98 < lcp0) {
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tlcp0 > lcp1\n",0xd);
            puVar4 = *local_c0;
            if (puVar4 == (uchar *)0x0) goto LAB_00244d6b;
            if (*from1 == (uchar *)0x0) goto LAB_00244d8a;
            iVar1 = strcmp((char *)puVar4,(char *)*from1);
            if (-1 < iVar1) {
              __assert_fail("cmp(*from0, *from1) < 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4ae,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                           );
            }
LAB_00244aba:
            *__dest = puVar4;
            lVar5 = *local_a8;
            local_c1 = *local_a0;
          }
          else {
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            if (lcp0 < local_98) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tlcp0 < lcp1\n",0xd);
              if (*local_c0 == (uchar *)0x0) goto LAB_00244d6b;
              puVar4 = *from1;
              if (puVar4 == (uchar *)0x0) goto LAB_00244d8a;
              iVar1 = strcmp((char *)*local_c0,(char *)puVar4);
              if (iVar1 < 1) {
                __assert_fail("cmp(*from0, *from1) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                              ,0x4b7,
                              "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                             );
              }
LAB_002449e2:
              *__dest = puVar4;
              local_98 = *local_90;
              c = *local_80;
LAB_00244a16:
              local_80 = local_80 + 1;
              local_90 = local_90 + 1;
              from1 = from1 + 1;
              __dest = __dest + 1;
              local_88 = local_88 - 1;
              if (local_88 == 0) goto LAB_00244474;
              goto LAB_002445e4;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tlcp0 == lcp1\n",0xe);
            if (local_c1 < c) {
              poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,
                                  __debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                                  __debug_indent_str_abi_cxx11_._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar2,"\t\tcache0 < cache1\n",0x12);
              puVar4 = *local_c0;
              if (puVar4 != (uchar *)0x0) {
                if (*from1 != (uchar *)0x0) {
                  iVar1 = strcmp((char *)puVar4,(char *)*from1);
                  if (-1 < iVar1) {
                    __assert_fail("cmp(*from0, *from1) < 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                                  ,0x4c6,
                                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                                 );
                  }
                  goto LAB_00244aba;
                }
                goto LAB_00244d8a;
              }
              goto LAB_00244d6b;
            }
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p
                                ,__debug_indent_str_abi_cxx11_._M_string_length);
            if (c < local_c1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar2,"\t\tcache0 > cache1\n",0x12);
              if (*local_c0 != (uchar *)0x0) {
                puVar4 = *from1;
                if (puVar4 != (uchar *)0x0) {
                  iVar1 = strcmp((char *)*local_c0,(char *)puVar4);
                  if (iVar1 < 1) {
                    __assert_fail("cmp(*from0, *from1) > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                                  ,0x4d6,
                                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                                 );
                  }
                  goto LAB_002449e2;
                }
                goto LAB_00244d8a;
              }
              goto LAB_00244d6b;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t\tcache0 == cache1\n",0x13)
            ;
            if (local_c1 == 0) {
              puVar4 = *local_c0;
              if (puVar4 != (uchar *)0x0) {
                if (*from1 != (uchar *)0x0) {
                  iVar1 = strcmp((char *)puVar4,(char *)*from1);
                  if (iVar1 != 0) {
                    __assert_fail("cmp(*from0, *from1) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                                  ,0x4e7,
                                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                                 );
                  }
                  goto LAB_00244aba;
                }
                goto LAB_00244d8a;
              }
              goto LAB_00244d6b;
            }
            compare((uchar *)&local_70,*local_c0,(size_t)*from1);
            lcp0 = CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_);
            local_98 = lcp0;
            if ((int)local_70._M_string_length < 0) {
              *__dest = *local_c0;
              if (*from1 != (uchar *)0x0) {
                local_c1 = *local_a0;
                lVar5 = *local_a8;
                c = (*from1)[lcp0];
                goto LAB_00244ae5;
              }
              goto LAB_00244e25;
            }
            if ((int)local_70._M_string_length != 0) {
              *__dest = *from1;
              if (*local_c0 != (uchar *)0x0) {
                local_c1 = (*local_c0)[lcp0];
                local_98 = *local_90;
                c = *local_80;
                goto LAB_00244a16;
              }
              goto LAB_00244e25;
            }
            *__dest = *local_c0;
            lVar5 = *local_a8;
            local_c1 = *local_a0;
            c = 0;
          }
LAB_00244ae5:
          local_a0 = local_a0 + 1;
          local_a8 = local_a8 + 1;
          local_c0 = local_c0 + 1;
          __dest = __dest + 1;
          local_b0 = local_b0 - 1;
          lcp0 = lVar5;
          if (local_b0 == 0) goto LAB_00244cde;
          goto LAB_002445e4;
        }
      }
    }
  }
LAB_00244cde:
  local_c0 = from1;
  local_b0 = local_88;
  if (local_88 == 0) {
    __assert_fail("n1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x51e,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned char]"
                 );
  }
LAB_00244cf6:
  memmove(__dest,local_c0,local_b0 << 3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,__debug_indent_str_abi_cxx11_._M_dataplus._M_p,
                      __debug_indent_str_abi_cxx11_._M_string_length);
  local_70._M_dataplus._M_p._0_1_ = 0x7e;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_70,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"merge_cache_lcp_2way",0x14);
  local_70._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_70,1);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}